

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptIntBounds.cpp
# Opt level: O2

SymBoundType __thiscall
GlobOpt::DetermineSymBoundOffsetOrValueRelativeToLandingPad
          (GlobOpt *this,StackSym *sym,bool landingPadValueIsLowerBound,ValueInfo *valueInfo,
          IntBounds *bounds,GlobOptBlockData *landingPadGlobOptBlockData,int *boundOffsetOrValueRef)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 *puVar4;
  Value *pVVar5;
  BaseDictionary<unsigned_int,_ValueRelativeOffset,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  *this_00;
  undefined7 in_register_00000011;
  SymBoundType SVar6;
  int local_48;
  ValueNumber local_44;
  int constantValue;
  ValueRelativeOffset *bound;
  int landingPadConstantValue;
  
  bound._4_4_ = (undefined4)CONCAT71(in_register_00000011,landingPadValueIsLowerBound);
  if (sym == (StackSym *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x51b,"(sym)","sym");
    if (!bVar2) goto LAB_00474e5c;
    *puVar4 = 0;
  }
  if ((sym->field_0x1a & 1) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x51c,"(!sym->IsTypeSpec())","!sym->IsTypeSpec()");
    if (!bVar2) goto LAB_00474e5c;
    *puVar4 = 0;
  }
  if (valueInfo == (ValueInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x51d,"(valueInfo)","valueInfo");
    if (!bVar2) goto LAB_00474e5c;
    *puVar4 = 0;
  }
  if (landingPadGlobOptBlockData == (GlobOptBlockData *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x51e,"(landingPadGlobOptBlockData)","landingPadGlobOptBlockData");
    if (!bVar2) goto LAB_00474e5c;
    *puVar4 = 0;
  }
  if (boundOffsetOrValueRef == (int *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x51f,"(boundOffsetOrValueRef)","boundOffsetOrValueRef");
    if (!bVar2) goto LAB_00474e5c;
    *puVar4 = 0;
  }
  bVar2 = ValueType::IsInt(&valueInfo->super_ValueType);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x520,"(valueInfo->IsInt())","valueInfo->IsInt()");
    if (!bVar2) goto LAB_00474e5c;
    *puVar4 = 0;
  }
  bVar2 = ValueInfo::TryGetIntConstantValue(valueInfo,&local_48,false);
  if (bVar2) {
    *boundOffsetOrValueRef = local_48;
    return VALUE;
  }
  if (bounds == (IntBounds *)0x0) {
    if (bound._4_1_ == '\0') {
      bVar2 = ValueInfo::TryGetIntConstantUpperBound(valueInfo,boundOffsetOrValueRef,false);
    }
    else {
      bVar2 = ValueInfo::TryGetIntConstantLowerBound(valueInfo,boundOffsetOrValueRef,false);
    }
    if (bVar2 != false) {
      return VALUE;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x556,
                       "(landingPadValueIsLowerBound ? valueInfo->TryGetIntConstantLowerBound(boundOffsetOrValueRef) : valueInfo->TryGetIntConstantUpperBound(boundOffsetOrValueRef))"
                       ,
                       "landingPadValueIsLowerBound ? valueInfo->TryGetIntConstantLowerBound(boundOffsetOrValueRef) : valueInfo->TryGetIntConstantUpperBound(boundOffsetOrValueRef)"
                      );
    if (bVar2) {
      *puVar4 = 0;
      return VALUE;
    }
LAB_00474e5c:
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  pVVar5 = GlobOptBlockData::FindValue(landingPadGlobOptBlockData,&sym->super_Sym);
  if (pVVar5 == (Value *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x52f,"(landingPadValue)","landingPadValue");
    if (!bVar2) goto LAB_00474e5c;
    *puVar4 = 0;
  }
  bVar2 = ValueType::IsInt(&pVVar5->valueInfo->super_ValueType);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x530,"(landingPadValue->GetValueInfo()->IsInt())",
                       "landingPadValue->GetValueInfo()->IsInt()");
    if (!bVar2) goto LAB_00474e5c;
    *puVar4 = 0;
  }
  _constantValue = (ValueRelativeOffset *)0x0;
  if (bound._4_1_ == '\0') {
    this_00 = &IntBounds::RelativeUpperBounds(bounds)->
               super_BaseDictionary<unsigned_int,_ValueRelativeOffset,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
    ;
  }
  else {
    this_00 = &IntBounds::RelativeLowerBounds(bounds)->
               super_BaseDictionary<unsigned_int,_ValueRelativeOffset,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
    ;
  }
  bVar2 = ValueInfo::TryGetIntConstantValue(pVVar5->valueInfo,(int32 *)&bound,false);
  if (bVar2) {
    SVar6 = VALUE;
    if (bound._4_1_ == '\0') {
      iVar3 = IntBounds::ConstantUpperBound(bounds);
      if (iVar3 <= (int)bound) goto LAB_00474e4a;
    }
    else {
      iVar3 = IntBounds::ConstantLowerBound(bounds);
      if ((int)bound <= iVar3) goto LAB_00474e4a;
    }
    local_44 = pVVar5->valueNumber;
    bVar2 = JsUtil::
            BaseDictionary<unsigned_int,_ValueRelativeOffset,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
            ::TryGetReference<unsigned_int>
                      (this_00,&local_44,(ValueRelativeOffset **)&constantValue);
    if (bVar2) {
      iVar3 = ValueRelativeOffset::Offset(_constantValue);
      iVar3 = iVar3 + (int)bound;
LAB_00474e4a:
      *boundOffsetOrValueRef = iVar3;
      return SVar6;
    }
  }
  else {
    local_44 = pVVar5->valueNumber;
    bVar2 = JsUtil::
            BaseDictionary<unsigned_int,_ValueRelativeOffset,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
            ::TryGetReference<unsigned_int>
                      (this_00,&local_44,(ValueRelativeOffset **)&constantValue);
    if (bVar2) {
      iVar3 = ValueRelativeOffset::Offset(_constantValue);
      SVar6 = OFFSET;
      goto LAB_00474e4a;
    }
  }
  return UNKNOWN;
}

Assistant:

GlobOpt::SymBoundType GlobOpt::DetermineSymBoundOffsetOrValueRelativeToLandingPad(
    StackSym *const sym,
    const bool landingPadValueIsLowerBound,
    ValueInfo *const valueInfo,
    const IntBounds *const bounds,
    GlobOptBlockData *const landingPadGlobOptBlockData,
    int *const boundOffsetOrValueRef)
{
    Assert(sym);
    Assert(!sym->IsTypeSpec());
    Assert(valueInfo);
    Assert(landingPadGlobOptBlockData);
    Assert(boundOffsetOrValueRef);
    Assert(valueInfo->IsInt());

    int constantValue;
    if(valueInfo->TryGetIntConstantValue(&constantValue))
    {
        // The sym's constant value is the constant bound value, so just return that. This is possible in loops such as
        // for(; i === 1; ++i){...}, where 'i' is an induction variable but has a constant value inside the loop, or in blocks
        // inside the loop such as if(i === 1){...}
        *boundOffsetOrValueRef = constantValue;
        return SymBoundType::VALUE;
    }

    if (bounds)
    {
        Value *const landingPadValue = landingPadGlobOptBlockData->FindValue(sym);
        Assert(landingPadValue);
        Assert(landingPadValue->GetValueInfo()->IsInt());

        int landingPadConstantValue;
        const ValueRelativeOffset* bound = nullptr;
        const RelativeIntBoundSet& boundSet = landingPadValueIsLowerBound ? bounds->RelativeLowerBounds() : bounds->RelativeUpperBounds();
        if (landingPadValue->GetValueInfo()->TryGetIntConstantValue(&landingPadConstantValue))
        {
            // The sym's bound already takes the landing pad constant value into consideration, unless the landing pad value was
            // updated to have a more aggressive range (and hence, now a constant value) as part of hoisting a bound check or some
            // other hoisting operation. The sym's bound also takes into consideration the change to the sym so far inside the loop,
            // and the landing pad constant value does not, so use the sym's bound by default.

            int constantBound = landingPadValueIsLowerBound ? bounds->ConstantLowerBound() : bounds->ConstantUpperBound();
            if(landingPadValueIsLowerBound ? landingPadConstantValue > constantBound : landingPadConstantValue < constantBound)
            {
                // The landing pad value became a constant value as part of a hoisting operation. The landing pad constant value is
                // a more aggressive bound, so use that instead, and take into consideration the change to the sym so far inside the
                // loop, using the relative bound to the landing pad value.
                if (!boundSet.TryGetReference(landingPadValue->GetValueNumber(), &bound))
                {
                    return SymBoundType::UNKNOWN;
                }
                constantBound = landingPadConstantValue + bound->Offset();
            }
            *boundOffsetOrValueRef = constantBound;
            return SymBoundType::VALUE;
        }

        if (!boundSet.TryGetReference(landingPadValue->GetValueNumber(), &bound))
        {
            return SymBoundType::UNKNOWN;
        }
        *boundOffsetOrValueRef = bound->Offset();
        return SymBoundType::OFFSET;
    }
    AssertVerify(
        landingPadValueIsLowerBound
        ? valueInfo->TryGetIntConstantLowerBound(boundOffsetOrValueRef)
        : valueInfo->TryGetIntConstantUpperBound(boundOffsetOrValueRef));

    return SymBoundType::VALUE;
}